

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O3

Vector2i __thiscall sf::priv::WindowImplX11::getPrimaryMonitorPosition(WindowImplX11 *this)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 in_RAX;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  Vector2i VVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int xRandRMinor;
  int xRandRMajor;
  undefined8 local_28;
  
  uVar2 = *(undefined8 *)(*(long *)(this->m_display + 0xe8) + 0x10 + (long)this->m_screen * 0x80);
  local_28 = in_RAX;
  lVar4 = XRRGetScreenResources(this->m_display,uVar2);
  if (lVar4 == 0) {
    poVar6 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"Failed to get the current screen resources for.primary monitor position",0x47
              );
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    VVar7.x = 0;
    VVar7.y = 0;
    return VVar7;
  }
  bVar3 = checkXRandR(this,(int *)((long)&local_28 + 4),(int *)&local_28);
  if (bVar3) {
    bVar3 = 2 < (int)local_28;
  }
  else {
    bVar3 = false;
    local_28 = 0;
    local_28._4_4_ = 0;
  }
  if (((local_28._4_4_ < 2) && (!(bool)(local_28._4_4_ == 1 & bVar3))) ||
     (lVar5 = XRRGetOutputPrimary(this->m_display,uVar2), lVar5 == 0)) {
    lVar5 = **(long **)(lVar4 + 0x28);
  }
  lVar5 = XRRGetOutputInfo(this->m_display,lVar4,lVar5);
  if (lVar5 == 0) {
    XRRFreeScreenResources(lVar4);
LAB_001e811c:
    poVar6 = err();
    pcVar9 = "Failed to get output info for.primary monitor position";
    lVar4 = 0x36;
  }
  else {
    if (*(short *)(lVar5 + 0x30) == 1) {
      XRRFreeScreenResources(lVar4);
      XRRFreeOutputInfo(lVar5);
      goto LAB_001e811c;
    }
    lVar8 = XRRGetCrtcInfo(this->m_display,lVar4,*(undefined8 *)(lVar5 + 8));
    if (lVar8 != 0) {
      uVar11 = (ulong)*(uint *)(lVar8 + 8);
      uVar1 = *(uint *)(lVar8 + 0xc);
      XRRFreeCrtcInfo(lVar8);
      XRRFreeOutputInfo(lVar5);
      XRRFreeScreenResources(lVar4);
      uVar10 = (ulong)uVar1 << 0x20;
      goto LAB_001e8165;
    }
    XRRFreeScreenResources(lVar4);
    XRRFreeOutputInfo(lVar5);
    poVar6 = err();
    pcVar9 = "Failed to get crtc info for.primary monitor position";
    lVar4 = 0x34;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar11 = 0;
  uVar10 = 0;
LAB_001e8165:
  return (Vector2i)(uVar11 | uVar10);
}

Assistant:

Vector2i WindowImplX11::getPrimaryMonitorPosition()
{
    Vector2i monitorPosition;

    // Get root window
    ::Window rootWindow = RootWindow(m_display, m_screen);

    // Get the screen resources
    XRRScreenResources* res = XRRGetScreenResources(m_display, rootWindow);
    if (!res)
    {
        err() << "Failed to get the current screen resources for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Get xRandr version
    int xRandRMajor, xRandRMinor;
    if (!checkXRandR(xRandRMajor, xRandRMinor))
        xRandRMajor = xRandRMinor = 0;

    RROutput output = getOutputPrimary(rootWindow, res, xRandRMajor, xRandRMinor);

    // Get output info from output
    XRROutputInfo* outputInfo = XRRGetOutputInfo(m_display, res, output);
    if (!outputInfo || outputInfo->connection == RR_Disconnected)
    {
        XRRFreeScreenResources(res);

        // If outputInfo->connection == RR_Disconnected, free output info
        if (outputInfo)
            XRRFreeOutputInfo(outputInfo);

        err() << "Failed to get output info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    // Retreive current RRMode, screen position and rotation
    XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, outputInfo->crtc);
    if (!crtcInfo)
    {
        XRRFreeScreenResources(res);
        XRRFreeOutputInfo(outputInfo);
        err() << "Failed to get crtc info for.primary monitor position" << std::endl;
        return monitorPosition;
    }

    monitorPosition.x = crtcInfo->x;
    monitorPosition.y = crtcInfo->y;

    XRRFreeCrtcInfo(crtcInfo);
    XRRFreeOutputInfo(outputInfo);
    XRRFreeScreenResources(res);

    return monitorPosition;
}